

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.cc
# Opt level: O3

Matrix33d * gmath::createRy(Matrix33d *__return_storage_ptr__,double a)

{
  double dVar1;
  
  dVar1 = cos(a);
  __return_storage_ptr__->v[0][0] = dVar1;
  __return_storage_ptr__->v[0][1] = 0.0;
  dVar1 = sin(a);
  __return_storage_ptr__->v[0][2] = dVar1;
  *(undefined4 *)__return_storage_ptr__->v[1] = 0;
  *(undefined4 *)((long)__return_storage_ptr__->v[1] + 4) = 0;
  *(undefined4 *)(__return_storage_ptr__->v[1] + 1) = 0;
  *(undefined4 *)((long)__return_storage_ptr__->v[1] + 0xc) = 0x3ff00000;
  __return_storage_ptr__->v[1][2] = 0.0;
  dVar1 = sin(a);
  __return_storage_ptr__->v[2][0] = -dVar1;
  __return_storage_ptr__->v[2][1] = 0.0;
  dVar1 = cos(a);
  __return_storage_ptr__->v[2][2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

Matrix33d createRy(double a)
{
  Matrix33d ret;

  ret(0, 0)=cos(a);
  ret(0, 1)=0.0;
  ret(0, 2)=sin(a);

  ret(1, 0)=0.0;
  ret(1, 1)=1.0;
  ret(1, 2)=0.0;

  ret(2, 0)=-sin(a);
  ret(2, 1)=0.0;
  ret(2, 2)=cos(a);

  return ret;
}